

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall
helics::LogManager::setLoggingFile(LogManager *this,string_view lfile,string *identifier)

{
  string *this_00;
  size_type sVar1;
  bool bVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string sStack_b8;
  _Any_data local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  sStack_b8.field_2._8_8_ = lfile._M_str;
  sStack_b8.field_2._M_allocated_capacity = lfile._M_len;
  this_00 = &this->logFile;
  sVar1 = (this->logFile)._M_string_length;
  if (sVar1 != 0) {
    __y._M_str = (this_00->_M_dataplus)._M_p;
    __y._M_len = sVar1;
    bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)lfile,__y);
    if (bVar2) goto LAB_002b93fb;
  }
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)this_00,
             (basic_string_view<char,_std::char_traits<char>_> *)&sStack_b8.field_2);
  if ((this->logFile)._M_string_length == 0) {
    if ((this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      spdlog::drop((string *)this);
      CLI::std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)
      ;
    }
  }
  else {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    spdlog::basic_logger_mt<spdlog::synchronous_factory>
              (&sStack_b8,identifier,SUB81(this_00,0),(file_event_handlers *)0x0);
    CLI::std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)&sStack_b8);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_b8._M_string_length);
    spdlog::file_event_handlers::~file_event_handlers((file_event_handlers *)&local_98);
  }
LAB_002b93fb:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->logIdentifier,identifier);
  return;
}

Assistant:

void LogManager::setLoggingFile(std::string_view lfile, const std::string& identifier)
{
    if (logFile.empty() || lfile != logFile) {
        logFile = lfile;
        if (!logFile.empty()) {
            fileLogger = spdlog::basic_logger_mt(identifier, logFile);
        } else {
            if (fileLogger) {
                spdlog::drop(logIdentifier);
                fileLogger.reset();
            }
        }
    }
    logIdentifier = identifier;
}